

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool InputTextFilterCharacter
               (uint *p_char,ImGuiInputTextFlags flags,ImGuiInputTextCallback callback,
               void *user_data)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RCX;
  code *in_RDX;
  uint in_ESI;
  uint *in_RDI;
  bool bVar3;
  ImGuiInputTextCallbackData callback_data;
  bool pass;
  uint c;
  bool local_6a;
  bool local_69;
  undefined4 local_68;
  uint local_64;
  undefined8 local_60;
  ushort local_58;
  undefined1 local_2d;
  uint local_2c;
  undefined8 local_28;
  code *local_20;
  uint local_14;
  uint *local_10;
  bool local_1;
  
  local_2c = *in_RDI;
  if (local_2c < 0x20) {
    bVar1 = (in_ESI & 0x100000) != 0;
    local_69 = local_2c == 10 && bVar1;
    bVar3 = (in_ESI & 0x400) != 0;
    local_6a = local_2c == 9 && bVar3;
    local_2d = local_69 || local_6a;
    if ((local_2c != 10 || !bVar1) && (local_2c != 9 || !bVar3)) {
      return false;
    }
  }
  if (local_2c == 0x7f) {
    local_1 = false;
  }
  else if ((local_2c < 0xe000) || (0xf8ff < local_2c)) {
    if (local_2c < 0x10000) {
      local_28 = in_RCX;
      local_20 = in_RDX;
      local_14 = in_ESI;
      local_10 = in_RDI;
      if ((in_ESI & 0x2000f) != 0) {
        if ((((in_ESI & 1) != 0) && (((local_2c < 0x30 || (0x39 < local_2c)) && (local_2c != 0x2e)))
            ) && ((((local_2c != 0x2d && (local_2c != 0x2b)) && (local_2c != 0x2a)) &&
                  (local_2c != 0x2f)))) {
          return false;
        }
        if ((((in_ESI & 0x20000) != 0) && ((local_2c < 0x30 || (0x39 < local_2c)))) &&
           ((local_2c != 0x2e &&
            (((((local_2c != 0x2d && (local_2c != 0x2b)) && (local_2c != 0x2a)) &&
              ((local_2c != 0x2f && (local_2c != 0x65)))) && (local_2c != 0x45)))))) {
          return false;
        }
        if (((((in_ESI & 2) != 0) && ((local_2c < 0x30 || (0x39 < local_2c)))) &&
            ((local_2c < 0x61 || (0x66 < local_2c)))) && ((local_2c < 0x41 || (0x46 < local_2c)))) {
          return false;
        }
        if ((((in_ESI & 4) != 0) && (0x60 < local_2c)) && (local_2c < 0x7b)) {
          local_2c = local_2c - 0x20;
          *in_RDI = local_2c;
        }
        if (((in_ESI & 8) != 0) && (bVar1 = ImCharIsBlankW(local_2c), bVar1)) {
          return false;
        }
      }
      if ((local_14 & 0x200) != 0) {
        ImGuiInputTextCallbackData::ImGuiInputTextCallbackData
                  ((ImGuiInputTextCallbackData *)0x212a6d);
        memset(&local_68,0,0x38);
        local_68 = 0x200;
        local_58 = (ushort)local_2c;
        local_64 = local_14;
        local_60 = local_28;
        iVar2 = (*local_20)(&local_68);
        if (iVar2 != 0) {
          return false;
        }
        *local_10 = (uint)local_58;
        if (local_58 == 0) {
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool InputTextFilterCharacter(unsigned int* p_char, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    unsigned int c = *p_char;

    // Filter non-printable (NB: isprint is unreliable! see #2467)
    if (c < 0x20)
    {
        bool pass = false;
        pass |= (c == '\n' && (flags & ImGuiInputTextFlags_Multiline));
        pass |= (c == '\t' && (flags & ImGuiInputTextFlags_AllowTabInput));
        if (!pass)
            return false;
    }

    // We ignore Ascii representation of delete (emitted from Backspace on OSX, see #2578, #2817)
    if (c == 127)
        return false;

    // Filter private Unicode range. GLFW on OSX seems to send private characters for special keys like arrow keys (FIXME)
    if (c >= 0xE000 && c <= 0xF8FF)
        return false;

    // Filter Unicode ranges we are not handling in this build.
    if (c > IM_UNICODE_CODEPOINT_MAX)
        return false;

    // Generic named filters
    if (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase | ImGuiInputTextFlags_CharsNoBlank | ImGuiInputTextFlags_CharsScientific))
    {
        if (flags & ImGuiInputTextFlags_CharsDecimal)
            if (!(c >= '0' && c <= '9') && (c != '.') && (c != '-') && (c != '+') && (c != '*') && (c != '/'))
                return false;

        if (flags & ImGuiInputTextFlags_CharsScientific)
            if (!(c >= '0' && c <= '9') && (c != '.') && (c != '-') && (c != '+') && (c != '*') && (c != '/') && (c != 'e') && (c != 'E'))
                return false;

        if (flags & ImGuiInputTextFlags_CharsHexadecimal)
            if (!(c >= '0' && c <= '9') && !(c >= 'a' && c <= 'f') && !(c >= 'A' && c <= 'F'))
                return false;

        if (flags & ImGuiInputTextFlags_CharsUppercase)
            if (c >= 'a' && c <= 'z')
                *p_char = (c += (unsigned int)('A'-'a'));

        if (flags & ImGuiInputTextFlags_CharsNoBlank)
            if (ImCharIsBlankW(c))
                return false;
    }

    // Custom callback filter
    if (flags & ImGuiInputTextFlags_CallbackCharFilter)
    {
        ImGuiInputTextCallbackData callback_data;
        memset(&callback_data, 0, sizeof(ImGuiInputTextCallbackData));
        callback_data.EventFlag = ImGuiInputTextFlags_CallbackCharFilter;
        callback_data.EventChar = (ImWchar)c;
        callback_data.Flags = flags;
        callback_data.UserData = user_data;
        if (callback(&callback_data) != 0)
            return false;
        *p_char = callback_data.EventChar;
        if (!callback_data.EventChar)
            return false;
    }

    return true;
}